

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O1

int lj_cf_os_date(lua_State *L)

{
  TValue *pTVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  tm *__tp;
  size_t lenx;
  GCstr *pGVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  uint sz;
  lua_Number lVar9;
  time_t t;
  tm rtm;
  long local_88;
  SBuf *local_80;
  ulong local_78;
  char *local_70;
  tm local_68;
  
  pcVar4 = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    local_88 = time((time_t *)0x0);
  }
  else {
    lVar9 = luaL_checknumber(L,2);
    local_88 = (long)lVar9;
  }
  if (*pcVar4 == '!') {
    pcVar4 = pcVar4 + 1;
    __tp = gmtime_r(&local_88,&local_68);
  }
  else {
    __tp = localtime_r(&local_88,&local_68);
  }
  if (__tp == (tm *)0x0) {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    (pTVar1->field_2).it = 0xffffffff;
  }
  else {
    iVar3 = strcmp(pcVar4,"*t");
    if (iVar3 == 0) {
      lua_createtable(L,0,9);
      lua_pushinteger(L,(long)__tp->tm_sec);
      lua_setfield(L,-2,"sec");
      lua_pushinteger(L,(long)__tp->tm_min);
      lua_setfield(L,-2,"min");
      lua_pushinteger(L,(long)__tp->tm_hour);
      lua_setfield(L,-2,"hour");
      lua_pushinteger(L,(long)__tp->tm_mday);
      lua_setfield(L,-2,"day");
      lua_pushinteger(L,(long)__tp->tm_mon + 1);
      lua_setfield(L,-2,"month");
      lua_pushinteger(L,(long)__tp->tm_year + 0x76c);
      lua_setfield(L,-2,"year");
      lua_pushinteger(L,(long)__tp->tm_wday + 1);
      lua_setfield(L,-2,"wday");
      lua_pushinteger(L,(long)__tp->tm_yday + 1);
      lua_setfield(L,-2,"yday");
      if (-1 < __tp->tm_isdst) {
        lua_pushboolean(L,__tp->tm_isdst);
        lua_setfield(L,-2,"isdst");
      }
    }
    else if (*pcVar4 == '\0') {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      (pTVar1->u32).lo = (L->glref).ptr32 + 0xf8;
      (pTVar1->field_2).it = 0xfffffffb;
    }
    else {
      local_78 = (ulong)(L->glref).ptr32;
      cVar2 = *pcVar4;
      if (cVar2 == '\0') {
        sz = 0;
      }
      else {
        sz = 0;
        pcVar7 = pcVar4;
        do {
          pcVar7 = pcVar7 + 1;
          uVar8 = sz + 1;
          sz = sz + 0x1e;
          if (cVar2 != '%') {
            sz = uVar8;
          }
          cVar2 = *pcVar7;
        } while (cVar2 != '\0');
      }
      local_80 = (SBuf *)(local_78 + 0xe8);
      *(int *)(local_78 + 0xf4) = (int)L;
      iVar3 = -5;
      local_70 = pcVar4;
      do {
        pcVar4 = local_70;
        uVar6 = local_78;
        iVar3 = iVar3 + 1;
        if (iVar3 == 0) {
          return 1;
        }
        pcVar7 = (char *)(ulong)*(uint *)(local_78 + 0xf0);
        if (*(int *)(local_78 + 0xec) - *(uint *)(local_78 + 0xf0) < sz) {
          pcVar7 = lj_buf_need2(local_80,sz);
        }
        lenx = strftime(pcVar7,(ulong)(uint)(*(int *)(uVar6 + 0xec) - *(int *)(uVar6 + 0xf0)),pcVar4
                        ,__tp);
        if (lenx == 0) {
          sz = sz + (sz | 1);
        }
        else {
          pTVar1 = L->top;
          L->top = pTVar1 + 1;
          pGVar5 = lj_str_new(L,pcVar7,lenx);
          (pTVar1->u32).lo = (uint32_t)pGVar5;
          (pTVar1->field_2).it = 0xfffffffb;
          uVar6 = (ulong)(L->glref).ptr32;
          if (*(uint *)(uVar6 + 0x54) <= *(uint *)(uVar6 + 0x50)) {
            lj_gc_step(L);
          }
        }
      } while (lenx == 0);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(os_date)
{
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm *stm;
#if LJ_TARGET_POSIX
  struct tm rtm;
#endif
  if (*s == '!') {  /* UTC? */
    s++;  /* Skip '!' */
#if LJ_TARGET_POSIX
    stm = gmtime_r(&t, &rtm);
#else
    stm = gmtime(&t);
#endif
  } else {
#if LJ_TARGET_POSIX
    stm = localtime_r(&t, &rtm);
#else
    stm = localtime(&t);
#endif
  }
  if (stm == NULL) {  /* Invalid date? */
    setnilV(L->top++);
  } else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  } else if (*s) {
    SBuf *sb = &G(L)->tmpbuf;
    MSize sz = 0, retry = 4;
    const char *q;
    for (q = s; *q; q++)
      sz += (*q == '%') ? 30 : 1;  /* Overflow doesn't matter. */
    setsbufL(sb, L);
    while (retry--) {  /* Limit growth for invalid format or empty result. */
      char *buf = lj_buf_need(sb, sz);
      size_t len = strftime(buf, sbufsz(sb), s, stm);
      if (len) {
	setstrV(L, L->top++, lj_str_new(L, buf, len));
	lj_gc_check(L);
	break;
      }
      sz += (sz|1);
    }
  } else {
    setstrV(L, L->top++, &G(L)->strempty);
  }
  return 1;
}